

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCRgbaFile.cpp
# Opt level: O1

int ImfHeaderSetV3fAttribute(ImfHeader *hdr,char *name,float x,float y,float z)

{
  Iterator IVar1;
  iterator iVar2;
  TypedAttribute<Imath_3_2::Vec3<float>_> *pTVar3;
  V3f v;
  Vec3<float> local_40;
  TypedAttribute<Imath_3_2::Vec3<float>_> local_30;
  
  local_40.x = x;
  local_40.y = y;
  local_40.z = z;
  IVar1 = Imf_3_4::Header::find((Header *)hdr,name);
  iVar2._M_node = (_Base_ptr)Imf_3_4::Header::end((Header *)hdr);
  if (IVar1._i._M_node == (iterator)iVar2._M_node) {
    Imf_3_4::TypedAttribute<Imath_3_2::Vec3<float>_>::TypedAttribute(&local_30,&local_40);
    Imf_3_4::Header::insert((Header *)hdr,name,&local_30.super_Attribute);
    Imf_3_4::TypedAttribute<Imath_3_2::Vec3<float>_>::~TypedAttribute(&local_30);
  }
  else {
    pTVar3 = Imf_3_4::Header::typedAttribute<Imf_3_4::TypedAttribute<Imath_3_2::Vec3<float>>>
                       ((Header *)hdr,name);
    (pTVar3->_value).x = local_40.x;
    (pTVar3->_value).y = local_40.y;
    (pTVar3->_value).z = local_40.z;
  }
  return 1;
}

Assistant:

int
ImfHeaderSetV3fAttribute (
    ImfHeader* hdr, const char name[], float x, float y, float z)
{
    try
    {
        V3f v (x, y, z);

        if (header (hdr)->find (name) == header (hdr)->end ())
            header (hdr)->insert (
                name, OPENEXR_IMF_INTERNAL_NAMESPACE::V3fAttribute (v));
        else
            header (hdr)
                ->typedAttribute<OPENEXR_IMF_INTERNAL_NAMESPACE::V3fAttribute> (
                    name)
                .value () = v;

        return 1;
    }
    catch (const std::exception& e)
    {
        setErrorMessage (e);
        return 0;
    }
}